

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CCDPP_MPI.h
# Opt level: O2

void __thiscall CCDPP_MPI::~CCDPP_MPI(CCDPP_MPI *this)

{
  thread_pool<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>
  *this_00;
  
  this_00 = this->thread_pool;
  if (this_00 !=
      (thread_pool<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>
       *)0x0) {
    boost::threadpool::
    thread_pool<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>
    ::~thread_pool(this_00);
  }
  operator_delete(this_00);
  if (this->Q != (value_type_conflict1 *)0x0) {
    operator_delete__(this->Q);
  }
  if (this->P != (value_type_conflict1 *)0x0) {
    operator_delete__(this->P);
  }
  if (this->parameter->verbose == true) {
    if (this->entire_Q != (value_type_conflict1 *)0x0) {
      operator_delete__(this->entire_Q);
    }
    if (this->entire_P != (value_type_conflict1 *)0x0) {
      operator_delete__(this->entire_P);
    }
  }
  MPI_Finalize();
  std::_Vector_base<Rating,_std::allocator<Rating>_>::~_Vector_base
            (&(this->test_ratings).super__Vector_base<Rating,_std::allocator<Rating>_>);
  std::_Vector_base<Rating,_std::allocator<Rating>_>::~_Vector_base
            (&(this->train_ratings).super__Vector_base<Rating,_std::allocator<Rating>_>);
  std::
  _Hashtable<int,_std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>,_std::allocator<std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->item_user_R)._M_h);
  std::
  _Hashtable<int,_std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>,_std::allocator<std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->user_item_R)._M_h);
  return;
}

Assistant:

~CCDPP_MPI(){

        delete thread_pool;
        delete[] Q;
        delete[] P;

        if(parameter->verbose){
            delete[] entire_Q;
            delete[] entire_P;
        }

        MPI_Finalize();
    }